

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall c4::yml::Parser::_handle_indentation(Parser *this)

{
  ulong ahead;
  ulong uVar1;
  code *pcVar2;
  csubstr s;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  bool bVar8;
  undefined1 uVar9;
  State *pSVar10;
  char *pcVar11;
  size_t sVar12;
  NodeData *pNVar13;
  State *pSVar14;
  State *pSVar15;
  uint uVar16;
  ro_substr chars;
  csubstr fmt;
  csubstr fmt_00;
  csubstr rem;
  char msg [31];
  csubstr remt;
  char *in_stack_fffffffffffffe88;
  size_t in_stack_fffffffffffffe90;
  basic_substring<const_char> local_148;
  basic_substring<const_char> local_138;
  undefined6 uStack_128;
  undefined1 uStack_122;
  undefined1 uStack_121;
  undefined6 uStack_120;
  undefined1 uStack_11a;
  undefined1 uStack_119;
  undefined6 uStack_118;
  undefined1 uStack_112;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  char *pcStack_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  char *pcStack_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  char *pcStack_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  basic_substring<const_char> local_40;
  
  pSVar10 = this->m_state;
  if ((pSVar10->flags & 0x10) != 0) {
    uStack_128 = 0x6e6f6e5f7361;
    uStack_122 = 0x65;
    uStack_121 = 0x28;
    uStack_120 = 0x2929574f4c46;
    uStack_11a = 0;
    local_138.str = (char *)0x6166206b63656863;
    local_138.len._0_6_ = 0x203a64656c69;
    local_138.len._6_1_ = 0x28;
    local_138.len._7_1_ = 0x68;
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar2 = (code *)swi(3);
      uVar9 = (*pcVar2)();
      return (bool)uVar9;
    }
    local_68 = 0;
    uStack_60 = 0x7952;
    local_58 = 0;
    pcStack_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_48 = 0x65;
    in_stack_fffffffffffffe88 = (char *)0x0;
    in_stack_fffffffffffffe90 = 0x7952;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7952) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x7952) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_138,0x1f,LVar3,(this->m_stack).m_callbacks.m_user_data);
    pSVar10 = this->m_state;
  }
  if ((pSVar10->line_contents).rem.str != (pSVar10->line_contents).full.str) {
    return false;
  }
  ahead = (pSVar10->line_contents).indentation;
  local_148.str = (pSVar10->line_contents).rem.str;
  local_148.len = (pSVar10->line_contents).rem.len;
  local_40 = basic_substring<const_char>::triml(&local_148,' ');
  pcVar11 = local_40.str;
  sVar12 = local_148.len;
  if ((pcVar11 != (char *)0x0 && local_40.len != 0) && (*pcVar11 != '#')) {
    pSVar10 = this->m_state;
    uVar1 = pSVar10->indref;
    if (ahead == uVar1) {
      if (local_148.len < ahead) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar2 = (code *)swi(3);
          uVar9 = (*pcVar2)();
          return (bool)uVar9;
        }
        handle_error(0x1fce74,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                (&local_138,local_148.str + ahead,local_148.len - ahead);
      if ((CONCAT17(local_138.len._7_1_,CONCAT16(local_138.len._6_1_,(undefined6)local_138.len)) ==
           0) || (*local_138.str != '-')) {
        uVar16 = this->m_state->flags;
        if ((uVar16 & 4) == 0) {
          if (((uVar16 & 8) != 0) && (2 < (this->m_stack).m_size)) {
            if ((uVar16 >> 8 & 1) == 0) {
              if (-1 < (char)uVar16) goto LAB_001dbfaa;
              _append_val_null(this,local_148.str);
            }
            _pop_level(this);
            return true;
          }
        }
        else if ((~uVar16 & 0x280) == 0) {
          _append_key_val_null(this,local_148.str + (ahead - 1));
          this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
        }
      }
LAB_001dbfaa:
      _line_progressed(this,ahead);
      return ahead != 0;
    }
    if (uVar1 <= ahead) {
      if (ahead <= uVar1) {
        uStack_128 = 0x6d203e20646e;
        uStack_122 = 0x5f;
        uStack_121 = 0x73;
        uStack_120 = 0x3e2d65746174;
        local_138.str = (char *)0x6166206b63656863;
        local_138.len._0_6_ = 0x203a64656c69;
        local_138.len._6_1_ = 0x28;
        local_138.len._7_1_ = 0x69;
        uStack_11a = 0x69;
        uStack_119 = 0x6e;
        uStack_118 = 0x2966657264;
        if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar2 = (code *)swi(3);
          uVar9 = (*pcVar2)();
          return (bool)uVar9;
        }
        local_108 = 0;
        uStack_100 = 0x79dc;
        local_f8 = 0;
        pcStack_f0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_e8 = 0x65;
        in_stack_fffffffffffffe88 = (char *)0x0;
        in_stack_fffffffffffffe90 = 0x79dc;
        LVar5.super_LineCol.col = 0;
        LVar5.super_LineCol.offset = SUB168(ZEXT816(0x79dc) << 0x40,0);
        LVar5.super_LineCol.line = SUB168(ZEXT816(0x79dc) << 0x40,8);
        LVar5.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar5.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_138,0x26,LVar5,(this->m_stack).m_callbacks.m_user_data);
        pSVar10 = this->m_state;
      }
      uVar16 = pSVar10->flags;
      if ((~uVar16 & 0x84) == 0) {
        s.len = in_stack_fffffffffffffe90;
        s.str = in_stack_fffffffffffffe88;
        bVar8 = anon_unknown_0::_is_scalar_next__rmap_val(s);
        if (bVar8) {
          chars.len = 2;
          chars.str = ":?";
          sVar12 = basic_substring<const_char>::first_of(&local_40,chars,0);
          if (sVar12 == 0xffffffffffffffff) {
            return false;
          }
          pSVar10 = this->m_state;
          uVar16 = pSVar10->flags;
        }
        pSVar10->flags = uVar16 & 0xffffff3f | 0x40;
        _push_level(this,false);
        _move_scalar_from_top(this);
        _line_progressed(this,ahead);
        _save_indentation(this,0);
        return true;
      }
      if ((~uVar16 & 0x88) == 0) {
        return false;
      }
      bVar8 = is_debugger_attached();
      if ((bVar8) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar2 = (code *)swi(3);
        uVar9 = (*pcVar2)();
        return (bool)uVar9;
      }
      fmt.len = 0x42;
      fmt.str = "ERROR: parse error - indentation should not increase at this point";
      _err<>(this,fmt);
      return false;
    }
    uVar16 = pSVar10->flags;
    if ((char)uVar16 < '\0') {
      if ((uVar16 & 4) == 0) {
        if ((uVar16 & 8) != 0) {
          if ((uVar16 >> 9 & 1) != 0) {
            uStack_128 = 0x6e6f6e5f7361;
            uStack_122 = 0x65;
            uStack_121 = 0x28;
            uStack_120 = 0x29294c435353;
            uStack_11a = 0;
            local_138.str = (char *)0x6166206b63656863;
            local_138.len._0_6_ = 0x203a64656c69;
            local_138.len._6_1_ = 0x28;
            local_138.len._7_1_ = 0x68;
            if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
              pcVar2 = (code *)swi(3);
              uVar9 = (*pcVar2)();
              return (bool)uVar9;
            }
            local_b8 = 0;
            uStack_b0 = 0x7996;
            local_a8 = 0;
            pcStack_a0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_98 = 0x65;
            LVar4.super_LineCol.col = 0;
            LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7996) << 0x40,0);
            LVar4.super_LineCol.line = SUB168(ZEXT816(0x7996) << 0x40,8);
            LVar4.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar4.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      ((char *)&local_138,0x1f,LVar4,(this->m_stack).m_callbacks.m_user_data);
          }
          if (local_148.len < ahead) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
              pcVar2 = (code *)swi(3);
              uVar9 = (*pcVar2)();
              return (bool)uVar9;
            }
            handle_error(0x1fce74,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1533,"first >= 0 && first <= len");
          }
          basic_substring<const_char>::basic_substring
                    (&local_138,local_148.str + ahead,local_148.len - ahead);
          _append_val_null(this,local_138.str + -1);
        }
      }
      else {
        if ((uVar16 >> 9 & 1) == 0) {
          uStack_128 = 0x6c6c615f7361;
          uStack_122 = 0x28;
          uStack_121 = 0x53;
          uStack_120 = 0x29294c4353;
          local_138.str = (char *)0x6166206b63656863;
          local_138.len._0_6_ = 0x203a64656c69;
          local_138.len._6_1_ = 0x28;
          local_138.len._7_1_ = 0x68;
          if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
            pcVar2 = (code *)swi(3);
            uVar9 = (*pcVar2)();
            return (bool)uVar9;
          }
          local_90 = 0;
          uStack_88 = 0x7991;
          local_80 = 0;
          pcStack_78 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_70 = 0x65;
          LVar6.super_LineCol.col = 0;
          LVar6.super_LineCol.offset = SUB168(ZEXT816(0x7991) << 0x40,0);
          LVar6.super_LineCol.line = SUB168(ZEXT816(0x7991) << 0x40,8);
          LVar6.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          LVar6.name.len = 0x65;
          (*(this->m_stack).m_callbacks.m_error)
                    ((char *)&local_138,0x1e,LVar6,(this->m_stack).m_callbacks.m_user_data);
        }
        if (local_148.len < ahead) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
            pcVar2 = (code *)swi(3);
            uVar9 = (*pcVar2)();
            return (bool)uVar9;
          }
          handle_error(0x1fce74,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  (&local_138,local_148.str + ahead,local_148.len - ahead);
        _append_key_val_null(this,local_138.str + -1);
      }
    }
    pSVar14 = (this->m_stack).m_stack;
    pSVar10 = this->m_state;
    do {
      pSVar15 = pSVar10;
      pSVar10 = pSVar15 + -1;
      if (pSVar10 < pSVar14) {
        pSVar10 = (State *)0x0;
        goto LAB_001dc15d;
      }
    } while (pSVar15[-1].indref != ahead);
    if ((((pSVar14 < pSVar10) && (pSVar15[-2].indref == ahead)) &&
        (pNVar13 = Tree::_p(this->m_tree,pSVar15[-1].node_id),
        ((pNVar13->m_type).type & SEQ) != NOTYPE)) &&
       ((pNVar13 = Tree::_p(this->m_tree,pSVar15[-2].node_id),
        ((pNVar13->m_type).type & MAP) != NOTYPE && (*pcVar11 != '-')))) {
      pSVar10 = pSVar15 + -2;
    }
    pSVar14 = this->m_state;
    if ((pSVar14 <= pSVar10) || (pSVar14->level <= pSVar10->level)) {
LAB_001dc15d:
      bVar8 = is_debugger_attached();
      if ((bVar8) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar2 = (code *)swi(3);
        uVar9 = (*pcVar2)();
        return (bool)uVar9;
      }
      fmt_00.len = 0x2a;
      fmt_00.str = "ERROR: parse error: incorrect indentation?";
      _err<>(this,fmt_00);
      goto LAB_001dc257;
    }
    while (pSVar14 != pSVar10) {
      _pop_level(this);
LAB_001dc257:
      pSVar14 = this->m_state;
    }
    sVar12 = ahead;
    if (ahead != pSVar14->indref) {
      uStack_128 = 0x203d3d20646e;
      uStack_122 = 0x6d;
      uStack_121 = 0x5f;
      uStack_120 = 0x2d6574617473;
      uStack_11a = 0x3e;
      local_138.str = (char *)0x6166206b63656863;
      local_138.len._0_6_ = 0x203a64656c69;
      local_138.len._6_1_ = 0x28;
      local_138.len._7_1_ = 0x69;
      uStack_119 = 0x69;
      uStack_118 = 0x29666572646e;
      uStack_112 = 0;
      if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar2 = (code *)swi(3);
        uVar9 = (*pcVar2)();
        return (bool)uVar9;
      }
      local_e0 = 0;
      uStack_d8 = 0x79d5;
      local_d0 = 0;
      pcStack_c8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_c0 = 0x65;
      LVar7.super_LineCol.col = 0;
      LVar7.super_LineCol.offset = SUB168(ZEXT816(0x79d5) << 0x40,0);
      LVar7.super_LineCol.line = SUB168(ZEXT816(0x79d5) << 0x40,8);
      LVar7.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar7.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_138,0x27,LVar7,(this->m_stack).m_callbacks.m_user_data);
    }
  }
  _line_progressed(this,sVar12);
  return true;
}

Assistant:

bool Parser::_handle_indentation()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(FLOW));
    if( ! _at_line_begin())
        return false;

    size_t ind = m_state->line_contents.indentation;
    csubstr rem = m_state->line_contents.rem;
    /** @todo instead of trimming, we should use the indentation index from above */
    csubstr remt = rem.triml(' ');

    if(remt.empty() || remt.begins_with('#')) // this is a blank or comment line
    {
        _line_progressed(rem.size());
        return true;
    }

    _c4dbgpf("indentation? ind={} indref={}", ind, m_state->indref);
    if(ind == m_state->indref)
    {
        _c4dbgpf("same indentation: {}", ind);
        if(!rem.sub(ind).begins_with('-'))
        {
            _c4dbgp("does not begin with -");
            if(has_any(RMAP))
            {
                if(has_all(SSCL|RVAL))
                {
                    _c4dbgp("add with null val");
                    _append_key_val_null(rem.str + ind - 1);
                    addrem_flags(RKEY, RVAL);
                }
            }
            else if(has_any(RSEQ))
            {
                if(m_stack.size() > 2) // do not pop to root level
                {
                    if(has_any(RNXT))
                    {
                        _c4dbgp("end the indentless seq");
                        _pop_level();
                        return true;
                    }
                    else if(has_any(RVAL))
                    {
                        _c4dbgp("add with null val");
                        _append_val_null(rem.str);
                        _c4dbgp("end the indentless seq");
                        _pop_level();
                        return true;
                    }
                }
            }
        }
        _line_progressed(ind);
        return ind > 0;
    }
    else if(ind < m_state->indref)
    {
        _c4dbgpf("smaller indentation ({} < {})!!!", ind, m_state->indref);
        if(has_all(RVAL))
        {
            _c4dbgp("there was an empty val -- appending");
            if(has_all(RMAP))
            {
                _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(SSCL));
                _append_key_val_null(rem.sub(ind).str - 1);
            }
            else if(has_all(RSEQ))
            {
                _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(SSCL));
                _append_val_null(rem.sub(ind).str - 1);
            }
        }
        // search the stack frame to jump to based on its indentation
        State const* popto = nullptr;
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_stack.is_contiguous()); // this search relies on the stack being contiguous
        for(State const* s = m_state-1; s >= m_stack.begin(); --s)
        {
            _c4dbgpf("searching for state with indentation {}. curr={} (level={},node={})", ind, s->indref, s->level, s->node_id);
            if(s->indref == ind)
            {
                _c4dbgpf("gotit!!! level={} node={}", s->level, s->node_id);
                popto = s;
                // while it may be tempting to think we're done at this
                // point, we must still determine whether we're jumping to a
                // parent with the same indentation. Consider this case with
                // an indentless sequence:
                //
                // product:
                // - sku: BL394D
                //   quantity: 4
                //   description: Basketball
                //   price: 450.00
                // - sku: BL4438H
                //   quantity: 1
                //   description: Super Hoop
                //   price: 2392.00  # jumping one level here would be wrong.
                // tax: 1234.5       # we must jump two levels
                if(popto > m_stack.begin())
                {
                    auto parent = popto - 1;
                    if(parent->indref == popto->indref)
                    {
                        _c4dbgpf("the parent (level={},node={}) has the same indentation ({}). is this in an indentless sequence?", parent->level, parent->node_id, popto->indref);
                        _c4dbgpf("isseq(popto)={} ismap(parent)={}", m_tree->is_seq(popto->node_id), m_tree->is_map(parent->node_id));
                        if(m_tree->is_seq(popto->node_id) && m_tree->is_map(parent->node_id))
                        {
                            if( ! remt.begins_with('-'))
                            {
                                _c4dbgp("this is an indentless sequence");
                                popto = parent;
                            }
                            else
                            {
                                _c4dbgp("not an indentless sequence");
                            }
                        }
                    }
                }
                break;
            }
        }
        if(!popto || popto >= m_state || popto->level >= m_state->level)
        {
            _c4err("parse error: incorrect indentation?");
        }
        _c4dbgpf("popping {} levels: from level {} to level {}", m_state->level-popto->level, m_state->level, popto->level);
        while(m_state != popto)
        {
            _c4dbgpf("popping level {} (indentation={})", m_state->level, m_state->indref);
            _pop_level();
        }
        _RYML_CB_ASSERT(m_stack.m_callbacks, ind == m_state->indref);
        _line_progressed(ind);
        return true;
    }
    else
    {
        _c4dbgpf("larger indentation ({} > {})!!!", ind, m_state->indref);
        _RYML_CB_ASSERT(m_stack.m_callbacks, ind > m_state->indref);
        if(has_all(RMAP|RVAL))
        {
            if(_is_scalar_next__rmap_val(remt) && remt.first_of(":?") == npos)
            {
                _c4dbgpf("actually it seems a value: '{}'", remt);
            }
            else
            {
                addrem_flags(RKEY, RVAL);
                _start_unk();
                //_move_scalar_from_top();
                _line_progressed(ind);
                _save_indentation();
                return true;
            }
        }
        else if(has_all(RSEQ|RVAL))
        {
            // nothing to do here
        }
        else
        {
            _c4err("parse error - indentation should not increase at this point");
        }
    }

    return false;
}